

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void __thiscall embree::Texture::~Texture(Texture *this)

{
  alignedUSMFree(this->data);
  std::__cxx11::string::~string((string *)&this->fileName);
  return;
}

Assistant:

Texture::~Texture () {
    alignedUSMFree(data);
  }